

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int16 *
ma_dr_flac_open_and_read_pcm_frames_s16
          (ma_dr_flac_read_proc onRead,ma_dr_flac_seek_proc onSeek,void *pUserData,uint *channelsOut
          ,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac *pmVar1;
  undefined4 *in_RCX;
  ma_dr_flac_read_proc in_R8;
  ma_dr_flac_seek_proc in_R9;
  ma_dr_flac *pFlac;
  ma_uint64 *in_stack_00001ff0;
  uint *in_stack_00001ff8;
  uint *in_stack_00002000;
  ma_dr_flac *in_stack_00002008;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (ma_dr_flac_read_proc)0x0) {
    *(undefined4 *)in_R8 = 0;
  }
  if (in_R9 != (ma_dr_flac_seek_proc)0x0) {
    *(undefined8 *)in_R9 = 0;
  }
  pmVar1 = ma_dr_flac_open(in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (pmVar1 == (ma_dr_flac *)0x0) {
    local_8 = (ma_int16 *)0x0;
  }
  else {
    local_8 = ma_dr_flac__full_read_and_close_s16
                        (in_stack_00002008,in_stack_00002000,in_stack_00001ff8,in_stack_00001ff0);
  }
  return local_8;
}

Assistant:

MA_API ma_int16* ma_dr_flac_open_and_read_pcm_frames_s16(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s16(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}